

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlExpression.cpp
# Opt level: O2

GdlExpression * __thiscall
GdlStringExpression::ConvertFeatureSettingValue
          (GdlStringExpression *this,GdlFeatureDefn *pfeat,bool *fErr)

{
  ulong uVar1;
  byte *pbVar2;
  uint uVar3;
  GdlNumericExpression *this_00;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  allocator local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  if (pfeat->m_fStdLang != true) {
    std::__cxx11::string::string
              ((string *)&local_80,"Inappropriate value of feature setting: ",&local_a1);
    std::__cxx11::string::string((string *)&local_a0,(string *)&this->m_staValue);
    GrcErrorList::AddError
              (&g_errorList,0x844,
               &(this->super_GdlSimpleExpression).super_GdlExpression.super_GdlObject,&local_80,
               &local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_80);
    *fErr = true;
    return (GdlExpression *)this;
  }
  uVar1 = (this->m_staValue)._M_string_length;
  if (uVar1 < 5) {
    if (uVar1 != 4) {
      std::__cxx11::string::string
                ((string *)&local_60,"Possibly invalid language ID--4-byte string expected",
                 &local_a1);
      GrcErrorList::AddWarning
                (&g_errorList,0x9d8,
                 &(this->super_GdlSimpleExpression).super_GdlExpression.super_GdlObject,&local_60);
      std::__cxx11::string::~string((string *)&local_60);
      if (uVar1 == 0) {
        uVar6 = 0;
        uVar3 = 0;
        uVar5 = 0;
        uVar4 = 0;
        goto LAB_00139cfd;
      }
    }
  }
  else {
    std::__cxx11::string::string
              ((string *)&local_40,"Invalid language ID--must be a 4-byte string",&local_a1);
    GrcErrorList::AddError
              (&g_errorList,0x843,
               &(this->super_GdlSimpleExpression).super_GdlExpression.super_GdlObject,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    *fErr = true;
  }
  pbVar2 = (byte *)(this->m_staValue)._M_dataplus._M_p;
  uVar3 = (uint)*pbVar2 << 0x18;
  uVar4 = 0;
  if (uVar1 < 2) {
    uVar6 = 0;
    uVar5 = 0;
  }
  else {
    uVar5 = (uint)pbVar2[1] << 0x10;
    if (uVar1 == 2) {
      uVar6 = 0;
      uVar4 = 0;
    }
    else {
      uVar6 = (uint)pbVar2[2] << 8;
      uVar4 = 0;
      if (3 < uVar1) {
        uVar4 = (uint)pbVar2[3];
      }
    }
  }
LAB_00139cfd:
  this_00 = (GdlNumericExpression *)operator_new(0x40);
  GdlNumericExpression::GdlNumericExpression(this_00,uVar6 | uVar5 | uVar4 | uVar3);
  return (GdlExpression *)this_00;
}

Assistant:

GdlExpression * GdlStringExpression::ConvertFeatureSettingValue(GdlFeatureDefn * pfeat, bool & fErr)
{
	if (pfeat->IsLanguageFeature())
	{
		int nValue = 0;
		auto cb = m_staValue.length();
		if (m_staValue.length() > 4)
		{
			g_errorList.AddError(2115, this,
				"Invalid language ID--must be a 4-byte string");
			fErr = true;
		}
		else if (m_staValue.length() < 4)
		{
			g_errorList.AddWarning(2520, this,
				"Possibly invalid language ID--4-byte string expected");
		}
		gr::byte b1, b2, b3, b4;
		b1 = (cb > 0) ? m_staValue[0] : 0;
		b2 = (cb > 1) ? m_staValue[1] : 0;
		b3 = (cb > 2) ? m_staValue[2] : 0;
		b4 = (cb > 3) ? m_staValue[3] : 0;
		nValue = (b1 << 24) | (b2 << 16) | (b3 << 8) | b4;

		//	Caller will replace original expression with numeric value.
		GdlNumericExpression * pexpValue = new GdlNumericExpression(nValue);
		return pexpValue;
	}
	else
	{
		g_errorList.AddError(2116, this,
			"Inappropriate value of feature setting: ",
			m_staValue);
		fErr = true;
	}
	return this;
}